

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_free_withsiblings(lyd_node *node)

{
  lyd_node *plVar1;
  lyd_node *aux;
  lyd_node *iter;
  lyd_node *node_local;
  
  if (node != (lyd_node *)0x0) {
    aux = node->prev;
    while (plVar1 = node, aux->next != (lyd_node *)0x0) {
      plVar1 = aux->prev;
      lyd_free(aux);
      aux = plVar1;
    }
    while (aux = plVar1, aux != (lyd_node *)0x0) {
      plVar1 = aux->next;
      lyd_free(aux);
    }
  }
  return;
}

Assistant:

API void
lyd_free_withsiblings(struct lyd_node *node)
{
    struct lyd_node *iter, *aux;

    if (!node) {
        return;
    }

    /* optimization - avoid freeing (unlinking) the last node of the siblings list */
    /* so, first, free the node's predecessors to the beginning of the list ... */
    for(iter = node->prev; iter->next; iter = aux) {
        aux = iter->prev;
        lyd_free(iter);
    }
    /* ... then, the node is the first in the siblings list, so free them all */
    LY_TREE_FOR_SAFE(node, aux, iter) {
        lyd_free(iter);
    }
}